

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_stmt * rtreeCheckPrepare(RtreeCheck *pCheck,char *zFmt,...)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  sqlite3 *in_RCX;
  char *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  char *z;
  sqlite3_stmt *pRet;
  va_list ap;
  char **in_stack_ffffffffffffff00;
  __va_list_tag *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = sqlite3_vmprintf((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            in_stack_ffffffffffffff08);
  if (*(int *)(in_RDI + 0x40) == 0) {
    if (pcVar3 == (char *)0x0) {
      *(undefined4 *)(in_RDI + 0x40) = 7;
    }
    else {
      iVar2 = sqlite3_prepare_v2(in_RCX,in_RDX,in_stack_ffffffffffffff14,
                                 (sqlite3_stmt **)in_stack_ffffffffffffff08,
                                 in_stack_ffffffffffffff00);
      *(int *)(in_RDI + 0x40) = iVar2;
    }
  }
  sqlite3_free((void *)0x2968a6);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (sqlite3_stmt *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

static sqlite3_stmt *rtreeCheckPrepare(
  RtreeCheck *pCheck,             /* RtreeCheck object */
  const char *zFmt, ...           /* Format string and trailing args */
){
  va_list ap;
  char *z;
  sqlite3_stmt *pRet = 0;

  va_start(ap, zFmt);
  z = sqlite3_vmprintf(zFmt, ap);

  if( pCheck->rc==SQLITE_OK ){
    if( z==0 ){
      pCheck->rc = SQLITE_NOMEM;
    }else{
      pCheck->rc = sqlite3_prepare_v2(pCheck->db, z, -1, &pRet, 0);
    }
  }

  sqlite3_free(z);
  va_end(ap);
  return pRet;
}